

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O1

png_uint_32 random_32(void)

{
  long lVar1;
  uint uVar2;
  png_byte mark [4];
  
  do {
    lVar1 = 0;
    do {
      uVar2 = (store_pool_mark_store_seed_1 << 7 | store_pool_mark_store_seed_0 >> 0x19) ^
              store_pool_mark_store_seed_0 >> 0xc;
      store_pool_mark_store_seed_1 =
           store_pool_mark_store_seed_1 << 8 | store_pool_mark_store_seed_0 >> 0x18;
      store_pool_mark_store_seed_0 = store_pool_mark_store_seed_0 << 8 | uVar2 & 0xff;
      mark[lVar1] = (png_byte)uVar2;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    uVar2 = (uint)mark >> 0x18 | ((uint)mark & 0xff0000) >> 8 | ((uint)mark & 0xff00) << 8 |
            (int)mark << 0x18;
  } while (uVar2 == 0);
  return uVar2;
}

Assistant:

static png_uint_32
random_32(void)
{

   for (;;)
   {
      png_byte mark[4];
      png_uint_32 result;

      store_pool_mark(mark);
      result = png_get_uint_32(mark);

      if (result != 0)
         return result;
   }
}